

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teleport.c
# Opt level: O0

void level_tele(void)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  d_level dVar4;
  char cVar5;
  schar sVar6;
  boolean bVar7;
  xchar xVar8;
  byte bVar9;
  int iVar10;
  s_level *psVar11;
  obj *obj_00;
  char *pcVar12;
  d_level *local_250;
  d_level lsav;
  int llimit;
  obj *obj;
  s_level *first_plane;
  char local_228 [2];
  xchar destdnum;
  schar destlev;
  int trycnt;
  char qbuf [256];
  char local_118;
  char local_117;
  boolean force_dest;
  char buf [256];
  char *escape_by_flying;
  d_level newlevel;
  int newlev;
  
  buf[0xf8] = '\0';
  buf[0xf9] = '\0';
  buf[0xfa] = '\0';
  buf[0xfb] = '\0';
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  bVar3 = false;
  if (((((u.uhave._0_1_ & 1) != 0) || (u.uz.dnum == dungeon_topology.d_astral_level.dnum)) ||
      (u.uz.dnum == dungeon_topology.d_sokoban_dnum)) && (flags.debug == '\0')) {
    pline("You feel very disoriented for a moment.");
    return;
  }
  if ((((((u.uprops[0xf].intrinsic != 0) || (u.uprops[0xf].extrinsic != 0)) ||
        (((youmonst.data)->mflags1 & 0x4000000) != 0)) &&
       ((u.uprops[0x1b].intrinsic == 0 && (u.umonnum != 0x9e)))) &&
      ((youmonst.data)->mlet != '\x1c')) || (flags.debug != '\0')) {
    first_plane._4_4_ = 0;
    strcpy(local_228,"To what level do you want to teleport?");
    do {
      first_plane._4_4_ = first_plane._4_4_ + 1;
      if (first_plane._4_4_ == 2) {
        if (flags.debug == '\0') {
          strcat(local_228," [type a number]");
        }
        else {
          strcat(local_228," [type a number or ? for a menu]");
        }
      }
      getlin(local_228,&local_118);
      iVar10 = strcmp(&local_118,"\x1b");
      if (iVar10 == 0) {
        if (u.uprops[0x1c].intrinsic == 0) {
          return;
        }
        iVar10 = rnl(5);
        if (iVar10 == 0) {
          return;
        }
        pline("Oops...");
        goto LAB_002f9198;
      }
      iVar10 = strcmp(&local_118,"*");
      if (iVar10 == 0) goto LAB_002f9198;
      if ((u.uprops[0x1c].intrinsic != 0) && (iVar10 = rnl(5), iVar10 != 0)) {
        pline("Oops...");
        goto LAB_002f9198;
      }
      if ((flags.debug == '\0') || (iVar10 = strcmp(&local_118,"?"), iVar10 != 0)) {
        sVar6 = lev_by_name(&local_118);
        escape_by_flying._4_4_ = (int)sVar6;
        if (escape_by_flying._4_4_ == 0) {
          escape_by_flying._4_4_ = atoi(&local_118);
        }
      }
      else {
        first_plane._3_1_ = 0;
        first_plane._2_1_ = '\0';
        sVar6 = print_dungeon('\x01',(schar *)((long)&first_plane + 3),
                              (xchar *)((long)&first_plane + 2));
        escape_by_flying._4_4_ = (int)sVar6;
        if (escape_by_flying._4_4_ == 0) {
          return;
        }
        escape_by_flying._2_1_ = first_plane._2_1_;
        escape_by_flying._3_1_ = first_plane._3_1_;
        if ((first_plane._2_1_ == dungeon_topology.d_astral_level.dnum) &&
           (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) {
          psVar11 = get_first_elemental_plane();
          sprintf(&local_118,"Destination is first elemental plane");
          if (((u.uhave._0_1_ & 1) == 0) &&
             (obj_00 = mksobj(level,0xd9,'\x01','\0'), obj_00 != (obj *)0x0)) {
            addinv(obj_00);
            strcat(&local_118," with the amulet");
          }
          if (psVar11 == (s_level *)0x0) {
            local_250 = (d_level *)0x0;
          }
          else {
            local_250 = &psVar11->dlevel;
          }
          assign_level((d_level *)((long)&escape_by_flying + 2),local_250);
          pline("%s.",&local_118);
        }
        bVar3 = true;
      }
      bVar2 = false;
      if (escape_by_flying._4_4_ == 0) {
        bVar7 = digit(local_118);
        bVar2 = false;
        if (bVar7 == '\0') {
          if (local_118 == '-') {
            bVar7 = digit(local_117);
            bVar2 = false;
            if (bVar7 != '\0') goto LAB_002f8f30;
          }
          bVar2 = first_plane._4_4_ < 10;
        }
      }
LAB_002f8f30:
      iVar10 = escape_by_flying._4_4_;
    } while (bVar2);
    if (escape_by_flying._4_4_ == 0) {
      if (first_plane._4_4_ < 10) {
        cVar5 = yn_function("Go to Nowhere.  Are you sure?","ynq",'q');
        if (cVar5 != 'y') {
          return;
        }
        pcVar12 = "scream";
        if ((youmonst.data)->msound == '\0') {
          pcVar12 = "writhe";
        }
        pline("You %s in agony as your body begins to warp...",pcVar12);
        (*windowprocs.win_pause)(P_MESSAGE);
        pline("You cease to exist.");
        if (invent != (obj *)0x0) {
          pcVar12 = surface((int)u.ux,(int)u.uy);
          pline("Your possessions land on the %s with a thud.",pcVar12);
        }
        killer_format = 2;
        killer = "committed suicide";
        done(0);
        pline("An energized cloud of dust begins to coalesce.");
        pcVar12 = "";
        if (invent != (obj *)0x0) {
          pcVar12 = ", and you gather up all your possessions";
        }
        pline("Your body rematerializes%s.",pcVar12);
        return;
      }
    }
    else {
      if ((((flags.debug != '\0') || (escape_by_flying._4_4_ < 1)) || (u.uz.dnum == '\0')) ||
         (iVar1 = dungeons[u.uz.dnum].depth_start, xVar8 = dunlevs_in_dungeon(&u.uz),
         iVar10 <= iVar1 + xVar8)) {
        bVar7 = on_level(&u.uz,&dungeon_topology.d_knox_level);
        if (((bVar7 != '\0') ||
            (bVar7 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level), bVar7 != '\0')) &&
           (0 < escape_by_flying._4_4_)) {
          pline("You shudder for a moment.");
          return;
        }
        bVar7 = In_quest(&u.uz);
        if ((bVar7 != '\0') && (0 < escape_by_flying._4_4_)) {
          escape_by_flying._4_4_ = escape_by_flying._4_4_ + dungeons[u.uz.dnum].depth_start + -1;
        }
        goto LAB_002f91dd;
      }
      pline("You feel like bouncing off a solid wall!");
    }
  }
LAB_002f9198:
  iVar10 = random_teleport_level();
  escape_by_flying._4_4_ = iVar10;
  sVar6 = depth(&u.uz);
  if (iVar10 == sVar6) {
    pline("You shudder for a moment.");
    return;
  }
LAB_002f91dd:
  bVar7 = next_to_u();
  if (bVar7 == '\0') {
    pline("You shudder for a moment.");
  }
  else if (u.uz.dnum == dungeon_topology.d_astral_level.dnum) {
    xVar8 = dunlevs_in_dungeon(&u.uz);
    if ((escape_by_flying._4_4_ < 0) &&
       (iVar10 = -(int)xVar8,
       escape_by_flying._4_4_ != iVar10 &&
       SBORROW4(escape_by_flying._4_4_,iVar10) == escape_by_flying._4_4_ + xVar8 < 0)) {
      escape_by_flying._2_1_ = u.uz.dnum;
      escape_by_flying._3_1_ = xVar8 + (char)escape_by_flying._4_4_;
      schedule_goto((d_level *)((long)&escape_by_flying + 2),'\0','\0',0,(char *)0x0,(char *)0x0);
    }
    else {
      pline("You can\'t get there from here.");
    }
  }
  else {
    killer = (char *)0x0;
    if ((escape_by_flying._4_4_ < 0) && (!bVar3)) {
      if (u.ushops0[0] != '\0') {
        in_mklev = '\x01';
        u_left_shop(u.ushops0,'\x01');
        u.ushops[0] = '\0';
        u.ushops0[0] = '\0';
        in_mklev = '\0';
      }
      if (escape_by_flying._4_4_ < -9) {
        pline("You arrive in heaven.");
        verbalize("Thou art early, but we\'ll admit thee.");
        killer_format = 2;
        killer = "went to heaven prematurely";
      }
      else if (escape_by_flying._4_4_ == -9) {
        pline("You feel deliriously happy. ");
        pline("(In fact, you\'re on Cloud 9!) ");
        (*windowprocs.win_pause)(P_MESSAGE);
      }
      else {
        pline("You are now high above the clouds...");
      }
      if (killer == (char *)0x0) {
        if (((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
           ((youmonst.data)->mlet != '\x05')) {
          if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
             ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
            pline("Unfortunately, you don\'t know how to fly.");
            pline("You plummet a few thousand feet to your death.");
            sprintf(&local_118,"teleported out of the dungeon and fell to %s death",
                    genders[(int)(uint)(flags.female != '\0')].his);
            killer = &local_118;
            killer_format = 2;
          }
          else {
            buf._248_8_ = anon_var_dwarf_b1feb;
          }
        }
        else {
          buf._248_8_ = anon_var_dwarf_b1fe0;
        }
      }
    }
    dVar4 = u.uz;
    if (killer != (char *)0x0) {
      bVar9 = 0;
      if (escape_by_flying._4_4_ < -9) {
        bVar9 = 0xf6;
      }
      u.uz = (d_level)((ushort)bVar9 << 8);
      done(0);
      buf._248_8_ = anon_var_dwarf_b202f;
    }
    iVar10 = escape_by_flying._4_4_;
    u.uz = dVar4;
    if (buf._248_8_ == 0) {
      u.uz.dnum = dVar4.dnum;
      if ((u.uz.dnum == dungeon_topology.d_medusa_level.dnum) &&
         (iVar1 = dungeons[u.uz.dnum].depth_start, xVar8 = dunlevs_in_dungeon(&u.uz), dVar4 = u.uz,
         iVar1 + xVar8 <= iVar10)) {
        if ((flags.debug == '\0') || (!bVar3)) {
          find_hell((d_level *)((long)&escape_by_flying + 2));
        }
      }
      else {
        u.uz = dVar4;
        if ((flags.debug == '\0') &&
           ((bVar7 = In_hell(&u.uz), iVar10 = escape_by_flying._4_4_, bVar7 != '\0' &&
            (((ushort)u.uevent._0_2_ >> 9 & 1) == 0)))) {
          iVar1 = dungeons[u.uz.dnum].depth_start;
          xVar8 = dunlevs_in_dungeon(&u.uz);
          if (iVar1 + xVar8 + -1 <= iVar10) {
            iVar10 = dungeons[u.uz.dnum].depth_start;
            xVar8 = dunlevs_in_dungeon(&u.uz);
            escape_by_flying._4_4_ = iVar10 + xVar8 + -2;
            pline("Sorry...");
          }
        }
        bVar7 = In_quest(&u.uz);
        iVar10 = escape_by_flying._4_4_;
        if ((bVar7 != '\0') && (sVar6 = depth(&dungeon_topology.d_qstart_level), iVar10 < sVar6)) {
          sVar6 = depth(&dungeon_topology.d_qstart_level);
          escape_by_flying._4_4_ = (int)sVar6;
        }
        if ((flags.debug == '\0') || (!bVar3)) {
          get_level((d_level *)((long)&escape_by_flying + 2),escape_by_flying._4_4_);
        }
      }
    }
    else {
      pline("You %s.",buf._248_8_);
      escape_by_flying._2_1_ = '\0';
      escape_by_flying._3_1_ = 0;
    }
    schedule_goto((d_level *)((long)&escape_by_flying + 2),'\0','\0',0,(char *)0x0,(char *)0x0);
    if ((u.utotype != '\0') && (flags.mon_moving == '\0')) {
      deferred_goto();
    }
  }
  return;
}

Assistant:

void level_tele(void)
{
	int newlev;
	d_level newlevel;
	const char *escape_by_flying = 0;	/* when surviving dest of -N */
	char buf[BUFSZ];
	boolean force_dest = FALSE;

	if ((u.uhave.amulet || In_endgame(&u.uz) || In_sokoban(&u.uz))
		&& !wizard) {
	    pline("You feel very disoriented for a moment.");
	    return;
	}
	if ((Teleport_control && !Stunned) || wizard) {
	    char qbuf[BUFSZ];
	    int trycnt = 0;

	    strcpy(qbuf, "To what level do you want to teleport?");
	    do {
		if (++trycnt == 2) {

			if (wizard) strcat(qbuf, " [type a number or ? for a menu]");
			else

			strcat(qbuf, " [type a number]");
		}
		getlin(qbuf, buf);
		if (!strcmp(buf,"\033")) {	/* cancelled */
		    if (Confusion && rnl(5)) {
			pline("Oops...");
			goto random_levtport;
		    }
		    return;
		} else if (!strcmp(buf,"*")) {
		    goto random_levtport;
		} else if (Confusion && rnl(5)) {
		    pline("Oops...");
		    goto random_levtport;
		}

		if (wizard && !strcmp(buf,"?")) {
		    schar destlev = 0;
		    xchar destdnum = 0;

		    if ((newlev = (int)print_dungeon(TRUE, &destlev, &destdnum))) {
			newlevel.dnum = destdnum;
			newlevel.dlevel = destlev;
			if (In_endgame(&newlevel) && !In_endgame(&u.uz)) {
				s_level *first_plane = get_first_elemental_plane();
				sprintf(buf,
				    "Destination is first elemental plane");
				if (!u.uhave.amulet) {
					struct obj *obj;
					obj = mksobj(level, AMULET_OF_YENDOR,
							TRUE, FALSE);
					if (obj) {
						addinv(obj);
						strcat(buf, " with the amulet");
					}
				}
				assign_level(&newlevel, first_plane ? &first_plane->dlevel : NULL);
				pline("%s.", buf);
			}
			force_dest = TRUE;
		    } else return;
		} else

		if ((newlev = lev_by_name(buf)) == 0) newlev = atoi(buf);
	    } while (!newlev && !digit(buf[0]) &&
		     (buf[0] != '-' || !digit(buf[1])) &&
		     trycnt < 10);

	    /* no dungeon escape via this route */
	    if (newlev == 0) {
		if (trycnt >= 10)
		    goto random_levtport;
		if (ynq("Go to Nowhere.  Are you sure?") != 'y') return;
		pline("You %s in agony as your body begins to warp...",
		    is_silent(youmonst.data) ? "writhe" : "scream");
		win_pause_output(P_MESSAGE);
		pline("You cease to exist.");
		if (invent) pline("Your possessions land on the %s with a thud.",
				surface(u.ux, u.uy));
		killer_format = NO_KILLER_PREFIX;
		killer = "committed suicide";
		done(DIED);
		pline("An energized cloud of dust begins to coalesce.");
		pline("Your body rematerializes%s.", invent ?
			", and you gather up all your possessions" : "");
		return;

	    /* only allow jump beyond Dungeons of Doom branch */
	    } else if (!wizard && newlev > 0 && u.uz.dnum != 0) {
		/* random teleport for destination level outside of
		 * the current dungeon branch
		 */
		if (newlev > dungeons[u.uz.dnum].depth_start +
			     dunlevs_in_dungeon(&u.uz)) {
		    pline("You feel like bouncing off a solid wall!");
		    goto random_levtport;
		}
	    }

	    /* if in Knox and the requested level > 0, stay put.
	     * we let negative values requests fall into the "heaven" loop.
	     */
	    if ((Is_knox(&u.uz) || Is_blackmarket(&u.uz)) && newlev > 0) {
		pline("You shudder for a moment.");
		return;
	    }
	    /* if in Quest, the player sees "Home 1", etc., on the status
	     * line, instead of the logical depth of the level.  controlled
	     * level teleport request is likely to be relativized to the
	     * status line, and consequently it should be incremented to
	     * the value of the logical depth of the target level.
	     *
	     * we let negative values requests fall into the "heaven" loop.
	     */
	    if (In_quest(&u.uz) && newlev > 0)
		newlev = newlev + dungeons[u.uz.dnum].depth_start - 1;
	} else { /* involuntary level tele */
 random_levtport:
	    newlev = random_teleport_level();
	    if (newlev == depth(&u.uz)) {
		pline("You shudder for a moment.");
		return;
	    }
	}

	if (!next_to_u()) {
		pline("You shudder for a moment.");
		return;
	}

	if (In_endgame(&u.uz)) {	/* must already be wizard */
	    int llimit = dunlevs_in_dungeon(&u.uz);

	    if (newlev >= 0 || newlev <= -llimit) {
		pline("You can't get there from here.");
		return;
	    }
	    newlevel.dnum = u.uz.dnum;
	    newlevel.dlevel = llimit + newlev;
	    schedule_goto(&newlevel, FALSE, FALSE, 0, NULL, NULL);
	    return;
	}

	killer = 0;		/* still alive, so far... */

	if (newlev < 0 && !force_dest) {
		if (*u.ushops0) {
		    /* take unpaid inventory items off of shop bills */
		    in_mklev = TRUE;	/* suppress map update */
		    u_left_shop(u.ushops0, TRUE);
		    /* you're now effectively out of the shop */
		    *u.ushops0 = *u.ushops = '\0';
		    in_mklev = FALSE;
		}
		if (newlev <= -10) {
			pline("You arrive in heaven.");
			verbalize("Thou art early, but we'll admit thee.");
			killer_format = NO_KILLER_PREFIX;
			killer = "went to heaven prematurely";
		} else if (newlev == -9) {
			pline("You feel deliriously happy. ");
			pline("(In fact, you're on Cloud 9!) ");
			win_pause_output(P_MESSAGE);
		} else
			pline("You are now high above the clouds...");

		if (killer) {
		    ;		/* arrival in heaven is pending */
		} else if (Levitation) {
		    escape_by_flying = "float gently down to earth";
		} else if (Flying) {
		    escape_by_flying = "fly down to the ground";
		} else {
		    pline("Unfortunately, you don't know how to fly.");
		    pline("You plummet a few thousand feet to your death.");
		    sprintf(buf,
			  "teleported out of the dungeon and fell to %s death",
			    uhis());
		    killer = buf;
		    killer_format = NO_KILLER_PREFIX;
		}
	}

	if (killer) {	/* the chosen destination was not survivable */
	    d_level lsav;

	    /* set specific death location; this also suppresses bones */
	    lsav = u.uz;	/* save current level, see below */
	    u.uz.dnum = 0;	/* main dungeon */
	    u.uz.dlevel = (newlev <= -10) ? -10 : 0;	/* heaven or surface */
	    done(DIED);
	    /* can only get here via life-saving (or declining to die in
	       explore|debug mode); the hero has now left the dungeon... */
	    escape_by_flying = "find yourself back on the surface";
	    u.uz = lsav;	/* restore u.uz so escape code works */
	}

	/* calls done(ESCAPED) if newlevel==0 */
	if (escape_by_flying) {
	    pline("You %s.", escape_by_flying);
	    newlevel.dnum = 0;		/* specify main dungeon */
	    newlevel.dlevel = 0;	/* escape the dungeon */
	    /* [dlevel used to be set to 1, but it doesn't make sense to
		teleport out of the dungeon and float or fly down to the
		surface but then actually arrive back inside the dungeon] */
	} else if (u.uz.dnum == medusa_level.dnum &&
	    newlev >= dungeons[u.uz.dnum].depth_start +
						dunlevs_in_dungeon(&u.uz)) {
	    if (!(wizard && force_dest))
		find_hell(&newlevel);
	} else {
	    /* if invocation did not yet occur, teleporting into
	     * the last level of Gehennom is forbidden.
	     */
	    if (!wizard)
	    if (Inhell && !u.uevent.invoked &&
			newlev >= (dungeons[u.uz.dnum].depth_start +
					dunlevs_in_dungeon(&u.uz) - 1)) {
		newlev = dungeons[u.uz.dnum].depth_start +
					dunlevs_in_dungeon(&u.uz) - 2;
		pline("Sorry...");
	    }
	    /* no teleporting out of quest dungeon */
	    if (In_quest(&u.uz) && newlev < depth(&qstart_level))
		newlev = depth(&qstart_level);
	    /* the player thinks of levels purely in logical terms, so
	     * we must translate newlev to a number relative to the
	     * current dungeon.
	     */
	    if (!(wizard && force_dest))
		get_level(&newlevel, newlev);
	}
	schedule_goto(&newlevel, FALSE, FALSE, 0, NULL, NULL);
	/* in case player just read a scroll and is about to be asked to
	   call it something, we can't defer until the end of the turn */
	if (u.utotype && !flags.mon_moving) deferred_goto();
}